

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

void re2::FactorAlternationImpl::Round3
               (Regexp **sub,int nsub,ParseFlags flags,
               vector<re2::Splice,_std::allocator<re2::Splice>_> *splices)

{
  iterator pRVar1;
  RegexpOp RVar2;
  Rune lo;
  Rune hi;
  ParseFlags parse_flags;
  iterator pRVar3;
  ostream *poVar4;
  ostream *poVar5;
  CharClass *cc_00;
  int local_264;
  Regexp **local_260;
  Regexp *local_258;
  Regexp *re;
  LogMessage local_230;
  iterator local_b0;
  iterator it;
  CharClass *cc;
  Regexp *local_90;
  Regexp *re_1;
  undefined1 local_80 [4];
  int j;
  CharClassBuilder ccb;
  Regexp *first_i;
  Regexp *pRStack_30;
  int i;
  Regexp *first;
  int start;
  vector<re2::Splice,_std::allocator<re2::Splice>_> *splices_local;
  ParseFlags flags_local;
  int nsub_local;
  Regexp **sub_local;
  
  first._4_4_ = 0;
  pRStack_30 = (Regexp *)0x0;
  first_i._4_4_ = 0;
  do {
    if (nsub < first_i._4_4_) {
      return;
    }
    ccb.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    if ((((nsub <= first_i._4_4_) ||
         (ccb.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)sub[first_i._4_4_],
         pRStack_30 == (Regexp *)0x0)) ||
        ((RVar2 = Regexp::op(pRStack_30), RVar2 != kRegexpLiteral &&
         (RVar2 = Regexp::op(pRStack_30), RVar2 != kRegexpCharClass)))) ||
       ((RVar2 = Regexp::op((Regexp *)ccb.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count),
        RVar2 != kRegexpLiteral &&
        (RVar2 = Regexp::op((Regexp *)ccb.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count),
        RVar2 != kRegexpCharClass)))) {
      if ((first_i._4_4_ != first._4_4_) && (first_i._4_4_ != first._4_4_ + 1)) {
        CharClassBuilder::CharClassBuilder((CharClassBuilder *)local_80);
        for (re_1._4_4_ = first._4_4_; re_1._4_4_ < first_i._4_4_; re_1._4_4_ = re_1._4_4_ + 1) {
          local_90 = sub[re_1._4_4_];
          RVar2 = Regexp::op(local_90);
          if (RVar2 == kRegexpCharClass) {
            it = (iterator)Regexp::cc(local_90);
            for (local_b0 = CharClass::begin((CharClass *)it); pRVar1 = local_b0,
                pRVar3 = CharClass::end((CharClass *)it), pRVar1 != pRVar3; local_b0 = local_b0 + 1)
            {
              CharClassBuilder::AddRange((CharClassBuilder *)local_80,local_b0->lo,local_b0->hi);
            }
          }
          else {
            RVar2 = Regexp::op(local_90);
            if (RVar2 != kRegexpLiteral) {
              LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_230,
                         "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/parse.cc"
                         ,0x4a1);
              poVar4 = LogMessage::stream(&local_230);
              poVar5 = std::operator<<((ostream *)poVar4,"RE2: unexpected op: ");
              RVar2 = Regexp::op(local_90);
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,RVar2);
              poVar5 = std::operator<<(poVar5," ");
              Regexp::ToString_abi_cxx11_((string *)&re,local_90);
              std::operator<<(poVar5,(string *)&re);
              std::__cxx11::string::~string((string *)&re);
              LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_230);
            }
            lo = Regexp::rune(local_90);
            hi = Regexp::rune(local_90);
            parse_flags = Regexp::parse_flags(local_90);
            CharClassBuilder::AddRangeFlags((CharClassBuilder *)local_80,lo,hi,parse_flags);
          }
          Regexp::Decref(local_90);
        }
        cc_00 = CharClassBuilder::GetCharClass((CharClassBuilder *)local_80);
        local_258 = Regexp::NewCharClass(cc_00,flags);
        local_260 = sub + first._4_4_;
        local_264 = first_i._4_4_ - first._4_4_;
        std::vector<re2::Splice,std::allocator<re2::Splice>>::
        emplace_back<re2::Regexp*&,re2::Regexp**,int>
                  ((vector<re2::Splice,std::allocator<re2::Splice>> *)splices,&local_258,&local_260,
                   &local_264);
        CharClassBuilder::~CharClassBuilder((CharClassBuilder *)local_80);
      }
      if (first_i._4_4_ < nsub) {
        first._4_4_ = first_i._4_4_;
        pRStack_30 = (Regexp *)ccb.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count;
      }
    }
    first_i._4_4_ = first_i._4_4_ + 1;
  } while( true );
}

Assistant:

void FactorAlternationImpl::Round3(Regexp** sub, int nsub,
                                   Regexp::ParseFlags flags,
                                   std::vector<Splice>* splices) {
  // Round 3: Merge runs of literals and/or character classes.
  int start = 0;
  Regexp* first = NULL;
  for (int i = 0; i <= nsub; i++) {
    // Invariant: sub[start:i] consists of regexps that all
    // are either literals (i.e. runes) or character classes.
    Regexp* first_i = NULL;
    if (i < nsub) {
      first_i = sub[i];
      if (first != NULL &&
          (first->op() == kRegexpLiteral ||
           first->op() == kRegexpCharClass) &&
          (first_i->op() == kRegexpLiteral ||
           first_i->op() == kRegexpCharClass))
        continue;
    }

    // Found end of a run of Literal/CharClass:
    // sub[start:i] all are either one or the other,
    // but sub[i] is not.
    if (i == start) {
      // Nothing to do - first iteration.
    } else if (i == start+1) {
      // Just one: don't bother factoring.
    } else {
      CharClassBuilder ccb;
      for (int j = start; j < i; j++) {
        Regexp* re = sub[j];
        if (re->op() == kRegexpCharClass) {
          CharClass* cc = re->cc();
          for (CharClass::iterator it = cc->begin(); it != cc->end(); ++it)
            ccb.AddRange(it->lo, it->hi);
        } else if (re->op() == kRegexpLiteral) {
          ccb.AddRangeFlags(re->rune(), re->rune(), re->parse_flags());
        } else {
          LOG(DFATAL) << "RE2: unexpected op: " << re->op() << " "
                      << re->ToString();
        }
        re->Decref();
      }
      Regexp* re = Regexp::NewCharClass(ccb.GetCharClass(), flags);
      splices->emplace_back(re, sub + start, i - start);
    }

    // Prepare for next iteration (if there is one).
    if (i < nsub) {
      start = i;
      first = first_i;
    }
  }
}